

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumDotsTexture::Evaluate
          (SpectrumDotsTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  anon_class_24_3_48d30edf func;
  bool bVar1;
  TaggedPointer<pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
  *this_00;
  Point2f st;
  SampledSpectrum SVar2;
  anon_class_16_2_278d1f37 func_00;
  undefined1 local_98 [16];
  Vector2f **ppVStack_88;
  float afStack_80 [2];
  Tuple2<pbrt::Vector2,_float> local_78;
  undefined8 local_70;
  Vector2f *local_68;
  undefined8 *local_60;
  TextureEvalContext local_58;
  
  local_60 = &local_70;
  local_98._8_8_ = &local_60;
  local_68 = (Vector2f *)&local_78;
  local_98._0_8_ = &local_58;
  local_70 = 0;
  ppVStack_88 = &local_68;
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_58.p.super_Tuple3<pbrt::Point3,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_58.p.super_Tuple3<pbrt::Point3,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_58.p.super_Tuple3<pbrt::Point3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_58.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_58.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_58.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_58.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_58.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_58.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_58.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  local_58.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  local_58.dudx = ctx.dudx;
  local_58.dudy = ctx.dudy;
  local_58.dvdx = ctx.dvdx;
  local_58.dvdy = ctx.dvdy;
  local_58.faceIndex = ctx.faceIndex;
  func.dstdx = (Vector2f **)local_98._8_8_;
  func.ctx = (TextureEvalContext *)local_98._0_8_;
  func.dstdy = ppVStack_88;
  st = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
       ::
       Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                 ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                   *)this,func);
  bVar1 = InsidePolkaDot(st);
  if (bVar1) {
    this_00 = (TaggedPointer<pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
               *)&this->insideDot;
  }
  else {
    this_00 = (TaggedPointer<pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
               *)&this->outsideDot;
  }
  local_58.p.super_Tuple3<pbrt::Point3,_float>.x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_58.p.super_Tuple3<pbrt::Point3,_float>.y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_58.p.super_Tuple3<pbrt::Point3,_float>.z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_58.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_58.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_58.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_58.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x
  ;
  local_58.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y
  ;
  local_58.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z
  ;
  local_58.uv.super_Tuple2<pbrt::Point2,_float>.x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  local_58.uv.super_Tuple2<pbrt::Point2,_float>.y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  local_58.dudx = ctx.dudx;
  local_58.dudy = ctx.dudy;
  local_58.dvdx = ctx.dvdx;
  local_58.dvdy = ctx.dvdy;
  local_58.faceIndex = ctx.faceIndex;
  local_98._0_4_ = lambda.lambda.values[0];
  local_98._4_4_ = lambda.lambda.values[1];
  local_98._8_4_ = lambda.lambda.values[2];
  local_98._12_4_ = lambda.lambda.values[3];
  ppVStack_88 = (Vector2f **)lambda.pdf.values._0_8_;
  afStack_80[0] = lambda.pdf.values[2];
  afStack_80[1] = lambda.pdf.values[3];
  func_00.lambda = (SampledWavelengths *)local_98;
  func_00.ctx = &local_58;
  SVar2 = TaggedPointer<pbrt::SpectrumImageTexture,pbrt::GPUSpectrumImageTexture,pbrt::SpectrumMixTexture,pbrt::SpectrumScaledTexture,pbrt::SpectrumConstantTexture,pbrt::SpectrumBilerpTexture,pbrt::SpectrumCheckerboardTexture,pbrt::MarbleTexture,pbrt::SpectrumDotsTexture,pbrt::SpectrumPtexTexture>
          ::
          Dispatch<pbrt::SpectrumTextureHandle::Evaluate(pbrt::TextureEvalContext,pbrt::SampledWavelengths)const::_lambda(auto:1)_1_>
                    (this_00,func_00);
  return (array<float,_4>)(array<float,_4>)SVar2;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return InsidePolkaDot(st) ? insideDot.Evaluate(ctx, lambda)
                                  : outsideDot.Evaluate(ctx, lambda);
    }